

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void check_pragma(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *tokens)

{
  short sVar1;
  ulong uVar2;
  token_t *pptVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 *puVar9;
  c2m_ctx_t pcVar10;
  char *pcVar11;
  char *pcVar12;
  node_t pnVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  c2m_ctx_t pcVar16;
  c2m_ctx_t unaff_RBX;
  char *pcVar17;
  node_t_conflict pnVar18;
  c2m_ctx_t unaff_R12;
  c2m_ctx_t unaff_R13;
  short *unaff_R14;
  c2m_ctx_t unaff_R15;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  val vVar22;
  pos_t pVar23;
  val vStack_108;
  val vStack_f8;
  c2m_ctx_t pcStack_e8;
  c2m_ctx_t pcStack_e0;
  c2m_ctx_t pcStack_d8;
  short *psStack_d0;
  c2m_ctx_t pcStack_c8;
  c2m_ctx_t pcStack_b8;
  c2m_ctx_t pcStack_b0;
  pre_ctx *ppStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  macro_t pmStack_90;
  macro mStack_88;
  
  if (tokens != (VARR_token_t *)0x0) {
    uVar2 = tokens->els_num;
    pptVar3 = tokens->varr;
    if (uVar2 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)(*(short *)*pptVar3 == 0x20);
    }
    if (((uVar2 <= uVar19) || (*(short *)pptVar3[uVar19] != 0x103)) ||
       (iVar6 = strcmp(pptVar3[uVar19]->repr,"STDC"), iVar6 != 0)) {
      uVar4._0_4_ = (t->pos).lno;
      uVar4._4_4_ = (t->pos).ln_pos;
      warning(c2m_ctx,0x1c18f0,(t->pos).fname,uVar4);
      return;
    }
    uVar20 = uVar19 + 1;
    if ((uVar20 < uVar2) && (*(short *)pptVar3[uVar19 + 1] == 0x20)) {
      uVar20 = uVar19 | 2;
    }
    if ((uVar20 < uVar2) && (*(short *)pptVar3[uVar20] == 0x103)) {
      pcVar17 = pptVar3[uVar20]->repr;
      iVar6 = strcmp(pcVar17,"FP_CONTRACT");
      if (((iVar6 != 0) && (iVar6 = strcmp(pcVar17,"FENV_ACCESS"), iVar6 != 0)) &&
         (iVar6 = strcmp(pcVar17,"CX_LIMITED_RANGE"), iVar6 != 0)) {
        pcVar12 = (t->pos).fname;
        uVar15._0_4_ = (t->pos).lno;
        uVar15._4_4_ = (t->pos).ln_pos;
        pcVar11 = "unknown STDC pragma %s";
LAB_001930e8:
        error(c2m_ctx,pcVar11,pcVar12,uVar15,pcVar17);
        return;
      }
      uVar19 = uVar20 + 1;
      if ((uVar19 < uVar2) && (*(short *)pptVar3[uVar20 + 1] == 0x20)) {
        uVar19 = uVar20 + 2;
      }
      if ((uVar19 < uVar2) && (*(short *)pptVar3[uVar19] == 0x103)) {
        pcVar17 = pptVar3[uVar19]->repr;
        if ((((*pcVar17 != 'O') || (pcVar17[1] != 'N')) || (pcVar17[2] != '\0')) &&
           ((iVar6 = strcmp(pcVar17,"OFF"), iVar6 != 0 &&
            (iVar6 = strcmp(pcVar17,"DEFAULT"), iVar6 != 0)))) {
          pcVar12 = (t->pos).fname;
          uVar15._0_4_ = (t->pos).lno;
          uVar15._4_4_ = (t->pos).ln_pos;
          pcVar11 = "unknown STDC pragma value";
          goto LAB_001930e8;
        }
        uVar20 = uVar19 + 1;
        if ((uVar20 < uVar2) &&
           ((*(short *)pptVar3[uVar19 + 1] == 0x20 || (*(short *)pptVar3[uVar19 + 1] == 10)))) {
          uVar20 = uVar19 + 2;
        }
        if (uVar2 <= uVar20) {
          return;
        }
        pcVar17 = (t->pos).fname;
        uVar14._0_4_ = (t->pos).lno;
        uVar14._4_4_ = (t->pos).ln_pos;
        pcVar12 = "garbage at STDC pragma end";
      }
      else {
        pcVar17 = (t->pos).fname;
        uVar14._0_4_ = (t->pos).lno;
        uVar14._4_4_ = (t->pos).ln_pos;
        pcVar12 = "wrong STDC pragma value";
      }
    }
    else {
      pcVar17 = (t->pos).fname;
      uVar14._0_4_ = (t->pos).lno;
      uVar14._4_4_ = (t->pos).ln_pos;
      pcVar12 = "wrong STDC pragma";
    }
    error(c2m_ctx,pcVar12,pcVar17,uVar14);
    return;
  }
  check_pragma_cold_1();
  pcVar17 = (char *)t;
  pcStack_b0 = c2m_ctx;
  if ((c2m_ctx_t)t != (c2m_ctx_t)0x0) {
    unaff_R12 = (c2m_ctx_t)((c2m_ctx_t)t)->ctx;
    if (unaff_R12 != (c2m_ctx_t)0x0) {
      iVar6 = 0;
      ppStack_a8 = c2m_ctx->pre_ctx;
      unaff_R15 = (c2m_ctx_t)&DAT_00000001;
      do {
        pnVar13 = (node_t)((c2m_ctx_t)t)->env[0].__jmpbuf[0];
        if (pnVar13 == (node_t)0x0) {
          pcStack_c8 = (c2m_ctx_t)0x1933e6;
          replace_defined_cold_3();
          unaff_R13 = (c2m_ctx_t)0x0;
LAB_001933e6:
          pcStack_c8 = (c2m_ctx_t)0x1933eb;
          replace_defined_cold_2();
          unaff_RBX = (c2m_ctx_t)t;
          goto LAB_001933eb;
        }
        unaff_R14 = *(short **)((long)pnVar13 + (long)unaff_R15 * 8 + -8);
        unaff_R13 = c2m_ctx;
        if (*unaff_R14 == 0x103) {
          unaff_R13 = *(c2m_ctx_t *)(unaff_R14 + 0x14);
          pcVar17 = "defined";
          pcStack_c8 = (c2m_ctx_t)0x1931d2;
          iVar7 = strcmp((char *)unaff_R13,"defined");
          if (iVar7 == 0) {
            pcVar16 = unaff_R15;
            if ((unaff_R15 < unaff_R12) &&
               (**(short **)(&pnVar13->code + (long)unaff_R15 * 2) == 0x20)) {
              pcVar16 = (c2m_ctx_t)((long)&unaff_R15->ctx + 1);
            }
            if (pcVar16 < unaff_R12) {
              unaff_R13 = (c2m_ctx_t)((long)&unaff_R15[-1].gen_ctx + 7);
              sVar1 = *(short *)*(token_t *)(&pnVar13->code + (long)pcVar16 * 2);
              if (sVar1 == 0x28) {
                pcVar10 = (c2m_ctx_t)((long)&pcVar16->ctx + 1);
                if ((pcVar10 < unaff_R12) && (*(&pnVar13->attr)[(long)pcVar16] == 0x20)) {
                  pcVar10 = (c2m_ctx_t)((long)&pcVar16->ctx + 2);
                }
                if ((pcVar10 < unaff_R12) &&
                   (*(short *)*(token_t *)(&pnVar13->code + (long)pcVar10 * 2) == 0x103)) {
                  pcVar17 = (char *)((long)&pcVar10->ctx + 1);
                  if ((pcVar17 < unaff_R12) && (*(&pnVar13->attr)[(long)pcVar10] == 0x20)) {
                    pcVar17 = (char *)((long)&pcVar10->ctx + 2);
                  }
                  if ((pcVar17 < unaff_R12) &&
                     (**(short **)(&pnVar13->code + (long)pcVar17 * 2) == 0x29)) {
                    pcStack_c8 = (c2m_ctx_t)0x193358;
                    pcStack_b8 = (c2m_ctx_t)pcVar17;
                    mStack_88.id = *(token_t *)(&pnVar13->code + (long)pcVar10 * 2);
                    iVar7 = HTAB_macro_t_do(ppStack_a8->macro_tab,&mStack_88,HTAB_FIND,&pmStack_90);
                    unaff_R12 = (c2m_ctx_t)0x1b530d;
                    if (iVar7 != 0) {
                      unaff_R12 = (c2m_ctx_t)0x1b3967;
                    }
                    uStack_a0 = *(undefined8 *)(unaff_R14 + 4);
                    uStack_98 = *(undefined8 *)(unaff_R14 + 8);
                    pcVar17 = (char *)0x30;
                    pcStack_c8 = (c2m_ctx_t)0x193385;
                    c2m_ctx = pcStack_b0;
                    puVar9 = (undefined4 *)reg_malloc(pcStack_b0,0x30);
                    *puVar9 = 0x100;
                    *(undefined8 *)(puVar9 + 2) = uStack_a0;
                    *(undefined8 *)(puVar9 + 4) = uStack_98;
                    *(c2m_ctx_t *)(puVar9 + 10) = unaff_R12;
                    puVar9[6] = 0;
                    *(undefined8 *)(puVar9 + 8) = 0;
                    pnVar13 = (node_t)((c2m_ctx_t)t)->env[0].__jmpbuf[0];
                    if ((pnVar13 != (node_t)0x0) && (unaff_R13 < (c2m_ctx_t)((c2m_ctx_t)t)->ctx))
                    goto LAB_001932ae;
                    goto LAB_001933f0;
                  }
                }
              }
              else if (sVar1 == 0x103) {
                pcStack_c8 = (c2m_ctx_t)0x193247;
                pcStack_b8 = pcVar16;
                mStack_88.id = *(token_t *)(&pnVar13->code + (long)pcVar16 * 2);
                iVar7 = HTAB_macro_t_do(ppStack_a8->macro_tab,&mStack_88,HTAB_FIND,&pmStack_90);
                unaff_R12 = (c2m_ctx_t)0x1b530d;
                if (iVar7 != 0) {
                  unaff_R12 = (c2m_ctx_t)0x1b3967;
                }
                uStack_a0 = *(undefined8 *)(unaff_R14 + 4);
                uStack_98 = *(undefined8 *)(unaff_R14 + 8);
                pcVar17 = (char *)0x30;
                pcStack_c8 = (c2m_ctx_t)0x193274;
                c2m_ctx = pcStack_b0;
                puVar9 = (undefined4 *)reg_malloc(pcStack_b0,0x30);
                *puVar9 = 0x100;
                *(undefined8 *)(puVar9 + 2) = uStack_a0;
                *(undefined8 *)(puVar9 + 4) = uStack_98;
                *(c2m_ctx_t *)(puVar9 + 10) = unaff_R12;
                puVar9[6] = 0;
                *(undefined8 *)(puVar9 + 8) = 0;
                pnVar13 = (node_t)((c2m_ctx_t)t)->env[0].__jmpbuf[0];
                if ((pnVar13 == (node_t)0x0) || ((c2m_ctx_t)((c2m_ctx_t)t)->ctx <= unaff_R13))
                goto LAB_001933e6;
LAB_001932ae:
                *(undefined4 **)((long)pnVar13 + (long)unaff_R15 * 8 + -8) = puVar9;
                pcVar17 = (char *)((ulong)unaff_R15 & 0xffffffff);
                pcStack_c8 = (c2m_ctx_t)0x1932c5;
                unaff_R13 = (c2m_ctx_t)t;
                del_tokens((VARR_token_t *)t,(int)unaff_R15,(int)pcStack_b8 + iVar6);
              }
            }
          }
        }
        unaff_R12 = (c2m_ctx_t)((c2m_ctx_t)t)->ctx;
        iVar6 = iVar6 + -1;
        bVar21 = unaff_R15 < unaff_R12;
        c2m_ctx = unaff_R13;
        unaff_R15 = (c2m_ctx_t)((long)&unaff_R15->ctx + 1);
      } while (bVar21);
    }
    return;
  }
LAB_001933eb:
  pcStack_c8 = (c2m_ctx_t)0x1933f0;
  replace_defined_cold_4();
  t = (token_t)unaff_RBX;
LAB_001933f0:
  pcStack_c8 = (c2m_ctx_t)eval;
  replace_defined_cold_1();
  pcStack_e8 = (c2m_ctx_t)t;
  pcStack_e0 = unaff_R12;
  pcStack_d8 = unaff_R13;
  psStack_d0 = unaff_R14;
  pcStack_c8 = unaff_R15;
  switch(*(node_code_t *)&((c2m_ctx_t)pcVar17)->ctx) {
  case N_IGNORE:
    pVar23 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                          (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar17)->ctx + 4));
    error(c2m_ctx,0x1c15f3,pVar23.fname,pVar23._8_8_);
    break;
  case N_I:
  case N_L:
  case N_LL:
    break;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    break;
  case N_ANDAND:
  case N_OROR:
    vVar22 = eval(c2m_ctx,(node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2]);
    if (*(node_code_t *)&((c2m_ctx_t)pcVar17)->ctx == N_ANDAND) {
      if (vVar22.u.i_val == 0) {
        return;
      }
    }
    else if (vVar22.u.i_val != 0) {
      return;
    }
    lVar5 = ((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2];
    if (lVar5 == 0) {
      pnVar18 = (node_t_conflict)0x0;
    }
    else {
      pnVar18 = *(node_t_conflict *)(lVar5 + 0x18);
    }
    eval(c2m_ctx,pnVar18);
    break;
  case N_EQ:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_NE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_LT:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_LE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_GT:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_GE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_BITWISE_NOT:
    eval(c2m_ctx,(node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2]);
    break;
  case N_NOT:
    eval(c2m_ctx,(node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2]);
    break;
  case N_AND:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_OR:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_XOR:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_LSH:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_RSH:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_ADD:
    pnVar18 = (node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2];
    if ((pnVar18 != (node_t_conflict)0x0) && ((pnVar18->op_link).next != (node_t)0x0)) {
      eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
      return;
    }
    goto LAB_001938c6;
  case N_SUB:
    pnVar18 = (node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2];
    if ((pnVar18 == (node_t_conflict)0x0) || ((pnVar18->op_link).next == (node_t)0x0)) {
      eval(c2m_ctx,pnVar18);
    }
    else {
      eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    }
    break;
  case N_MUL:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    break;
  case N_DIV:
  case N_MOD:
    eval_binop_operands(c2m_ctx,(node_t_conflict)pcVar17,&vStack_108,&vStack_f8);
    if (vStack_f8.u.i_val == 0) {
      pVar23 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                            (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar17)->ctx + 4))
      ;
      pcVar12 = "%";
      if (*(node_code_t *)&((c2m_ctx_t)pcVar17)->ctx == N_DIV) {
        pcVar12 = "/";
      }
      error(c2m_ctx,0x1c1611,pVar23.fname,pVar23._8_8_,pcVar12);
    }
    break;
  case N_COND:
    vVar22 = eval(c2m_ctx,(node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2]);
    pnVar18 = (node_t_conflict)((c2m_ctx_t)pcVar17)->env[0].__jmpbuf[2];
    if (pnVar18 == (node_t_conflict)0x0) {
      pnVar18 = (node_t_conflict)0x0;
    }
    else {
      uVar8 = (uint)(vVar22.u.i_val == 0);
      do {
        pnVar18 = (pnVar18->op_link).next;
        bVar21 = uVar8 != 0;
        uVar8 = uVar8 - 1;
        if (pnVar18 == (node_t_conflict)0x0) break;
      } while (bVar21);
    }
LAB_001938c6:
    eval(c2m_ctx,pnVar18);
  }
  return;
}

Assistant:

static void check_pragma (c2m_ctx_t c2m_ctx, token_t t, VARR (token_t) * tokens) {
  token_t *tokens_arr = VARR_ADDR (token_t, tokens);
  size_t i, tokens_len = VARR_LENGTH (token_t, tokens);

  i = 0;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
#ifdef _WIN32
  if (i + 1 == tokens_len && tokens_arr[i]->code == T_ID
      && strcmp (tokens_arr[i]->repr, "once") == 0) {
    pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
    VARR_PUSH (char_ptr_t, once_include_files, cs->fname);
    return;
  }
#endif
  if (i >= tokens_len || tokens_arr[i]->code != T_ID || strcmp (tokens_arr[i]->repr, "STDC") != 0) {
    warning (c2m_ctx, t->pos, "unknown pragma");
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "FP_CONTRACT") != 0
      && strcmp (tokens_arr[i]->repr, "FENV_ACCESS") != 0
      && strcmp (tokens_arr[i]->repr, "CX_LIMITED_RANGE") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma %s", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma value");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "ON") != 0 && strcmp (tokens_arr[i]->repr, "OFF") != 0
      && strcmp (tokens_arr[i]->repr, "DEFAULT") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma value", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && (tokens_arr[i]->code == ' ' || tokens_arr[i]->code == '\n')) i++;
  if (i < tokens_len) error (c2m_ctx, t->pos, "garbage at STDC pragma end");
}